

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::CommandBuffer>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  Environment *this;
  VkCommandPool *this_00;
  RefData<vk::VkCommandBuffer_s_*> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  allocator<char> local_231;
  string local_230;
  Move<vk::VkCommandBuffer_s_*> local_210;
  RefData<vk::VkCommandBuffer_s_*> local_1f0;
  undefined1 local_1d0 [8];
  Unique<vk::VkCommandBuffer_s_*> obj3;
  RefData<vk::VkCommandBuffer_s_*> local_190;
  undefined1 local_170 [8];
  Unique<vk::VkCommandBuffer_s_*> obj2;
  RefData<vk::VkCommandBuffer_s_*> local_130;
  undefined1 local_110 [8];
  Unique<vk::VkCommandBuffer_s_*> obj1;
  Move<vk::VkCommandBuffer_s_*> local_e0;
  RefData<vk::VkCommandBuffer_s_*> local_c0;
  undefined1 local_a0 [8];
  Unique<vk::VkCommandBuffer_s_*> obj0;
  Resources res;
  Environment env;
  Context *context_local;
  Parameters params_local;
  
  this = (Environment *)
         &res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
          m_allocator;
  context_local = (Context *)params;
  params_local = (Parameters)__return_storage_ptr__;
  Environment::Environment(this,context,4);
  this_00 = &obj0.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
  CommandBuffer::Resources::Resources((Resources *)this_00,this,(Parameters *)&context_local);
  CommandBuffer::create(&local_e0,this,(Resources *)this_00,(Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c0,(Move *)&local_e0);
  data.deleter.m_deviceIface = local_c0.deleter.m_deviceIface;
  data.object = local_c0.object;
  data.deleter.m_device = local_c0.deleter.m_device;
  data.deleter.m_pool.m_internal = local_c0.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_a0,data);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_e0);
  CommandBuffer::create
            ((Move<vk::VkCommandBuffer_s_*> *)
             &obj2.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (Environment *)
             &res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
              m_allocator,
             (Resources *)&obj0.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_130,(Move *)&obj2.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_00.deleter.m_deviceIface = local_130.deleter.m_deviceIface;
  data_00.object = local_130.object;
  data_00.deleter.m_device = local_130.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_130.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_110,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)
             &obj2.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  CommandBuffer::create
            ((Move<vk::VkCommandBuffer_s_*> *)
             &obj3.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (Environment *)
             &res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
              m_allocator,
             (Resources *)&obj0.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_190,(Move *)&obj3.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_01.deleter.m_deviceIface = local_190.deleter.m_deviceIface;
  data_01.object = local_190.object;
  data_01.deleter.m_device = local_190.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_190.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_170,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)
             &obj3.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  CommandBuffer::create
            (&local_210,
             (Environment *)
             &res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
              m_allocator,
             (Resources *)&obj0.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f0,(Move *)&local_210);
  data_02.deleter.m_deviceIface = local_1f0.deleter.m_deviceIface;
  data_02.object = local_1f0.object;
  data_02.deleter.m_device = local_1f0.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_1f0.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1d0,data_02);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_210);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1d0);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_170);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_110);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Ok",&local_231);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  CommandBuffer::Resources::~Resources
            ((Resources *)&obj0.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}